

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

String * __thiscall kj::_::CidrRange::toString(String *__return_storage_ptr__,CidrRange *this)

{
  Fault *pFVar1;
  uint *in_R8;
  char local_ad [13];
  Fault local_a0;
  Fault f;
  char result [128];
  CidrRange *this_local;
  
  pFVar1 = (Fault *)inet_ntop(this->family,this->bits,(char *)&f,0x80);
  if (pFVar1 == &f) {
    local_ad[0] = '/';
    str<char(&)[128],char,unsigned_int_const&>
              (__return_storage_ptr__,(kj *)&f,(char (*) [128])local_ad,(char *)&this->bitCount,
               in_R8);
    return __return_storage_ptr__;
  }
  Debug::Fault::Fault(&local_a0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                      ,0x83c,FAILED,
                      "inet_ntop(family, (void*)bits, result, sizeof(result)) == result","");
  Debug::Fault::fatal(&local_a0);
}

Assistant:

String CidrRange::toString() const {
  char result[128];
  KJ_ASSERT(inet_ntop(family, (void*)bits, result, sizeof(result)) == result);
  return kj::str(result, '/', bitCount);
}